

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProductEvaluators.h
# Opt level: O0

void __thiscall
Eigen::internal::
product_evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>,_7,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
::product_evaluator(product_evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_7,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                    *this,XprType *xpr)

{
  LhsNestedCleaned *lhs;
  RhsNestedCleaned *rhs;
  Index local_28;
  Index local_20;
  Product<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>
  *local_18;
  XprType *xpr_local;
  product_evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_7,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
  *this_local;
  
  local_18 = xpr;
  xpr_local = (XprType *)this;
  evaluator<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>_>::evaluator
            (&this->super_evaluator<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>);
  local_20 = Product<Eigen::Transpose<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>
             ::rows(local_18);
  local_28 = Product<Eigen::Transpose<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>
             ::cols(local_18);
  Matrix<double,1,-1,1,1,-1>::Matrix<long,long>
            ((Matrix<double,1,_1,1,1,_1> *)&this->m_result,&local_20,&local_28);
  evaluator<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>_>::evaluator
            (&this->super_evaluator<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,&this->m_result);
  lhs = Product<Eigen::Transpose<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>
        ::lhs(local_18);
  rhs = Product<Eigen::Transpose<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>
        ::rhs(local_18);
  generic_product_impl_base<Eigen::Transpose<Eigen::Matrix<double,-1,1,0,-1,1>>,Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::internal::generic_product_impl<Eigen::Transpose<Eigen::Matrix<double,-1,1,0,-1,1>>,Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::DenseShape,Eigen::DenseShape,7>>
  ::evalTo<Eigen::Matrix<double,1,_1,1,1,_1>>(&this->m_result,lhs,rhs);
  return;
}

Assistant:

explicit product_evaluator(const XprType& xpr)
    : m_result(xpr.rows(), xpr.cols())
  {
    ::new (static_cast<Base*>(this)) Base(m_result);

// FIXME shall we handle nested_eval here?,
// if so, then we must take care at removing the call to nested_eval in the specializations (e.g., in permutation_matrix_product, transposition_matrix_product, etc.)
//     typedef typename internal::nested_eval<Lhs,Rhs::ColsAtCompileTime>::type LhsNested;
//     typedef typename internal::nested_eval<Rhs,Lhs::RowsAtCompileTime>::type RhsNested;
//     typedef typename internal::remove_all<LhsNested>::type LhsNestedCleaned;
//     typedef typename internal::remove_all<RhsNested>::type RhsNestedCleaned;
//
//     const LhsNested lhs(xpr.lhs());
//     const RhsNested rhs(xpr.rhs());
//
//     generic_product_impl<LhsNestedCleaned, RhsNestedCleaned>::evalTo(m_result, lhs, rhs);

    generic_product_impl<Lhs, Rhs, LhsShape, RhsShape, ProductTag>::evalTo(m_result, xpr.lhs(), xpr.rhs());
  }